

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O3

void __thiscall
prevector_tests::prevector_tester<8U,_int>::~prevector_tester(prevector_tester<8U,_int> *this)

{
  pointer piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  lazy_ostream local_c0;
  undefined1 *local_b0;
  size_type **local_a8;
  assertion_result local_a0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  string local_68;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcf;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)this->passed;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  base_blob<256u>::ToString_abi_cxx11_(&local_68,&this->rand_seed);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_68,0,0,"insecure_rand: ",0xf);
  local_48 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48 == paVar3) {
    local_38 = paVar3->_M_allocated_capacity;
    uStack_30 = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    uStack_2c = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_48 = &local_38;
  }
  else {
    local_38 = paVar3->_M_allocated_capacity;
  }
  local_40 = pbVar2->_M_string_length;
  local_a8 = &local_48;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013adf88;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_c0,1,1,WARN,0xec20aa,(size_t)&stack0xffffffffffffff30,0xcf);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if (8 < (this->pre_vector_alt)._size) {
    free((this->pre_vector_alt)._union.indirect_contents.indirect);
    (this->pre_vector_alt)._union.indirect_contents.indirect = (char *)0x0;
  }
  if (8 < (this->pre_vector)._size) {
    free((this->pre_vector)._union.indirect_contents.indirect);
    (this->pre_vector)._union.indirect_contents.indirect = (char *)0x0;
  }
  piVar1 = (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->real_vector_alt).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~prevector_tester() {
        BOOST_CHECK_MESSAGE(passed, "insecure_rand: " + rand_seed.ToString());
    }